

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O2

void __thiscall cfd::SignParameter::SignParameter(SignParameter *this)

{
  core::ByteData::ByteData(&this->data_);
  this->data_type_ = kBinary;
  core::Pubkey::Pubkey(&this->related_pubkey_);
  this->der_encode_ = false;
  core::SigHashType::SigHashType(&this->sighash_type_);
  core::ScriptOperator::ScriptOperator
            (&this->op_code_,(ScriptOperator *)core::ScriptOperator::OP_INVALIDOPCODE);
  return;
}

Assistant:

SignParameter::SignParameter()
    : data_(),
      data_type_(SignDataType::kBinary),
      related_pubkey_(),
      der_encode_(false),
      sighash_type_(),
      op_code_(ScriptOperator::OP_INVALIDOPCODE) {
  // do nothing
}